

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O3

void __thiscall
coins_tests::updatecoins_simulation_test::test_method(updatecoins_simulation_test *this)

{
  key_type *__k;
  uchar *puVar1;
  FastRandomContext *this_00;
  _Base_ptr *this_01;
  COutPoint *out;
  _Base_ptr p_Var2;
  long lVar3;
  undefined8 uVar4;
  _func_int **pp_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  CCoinsViewBacked *pCVar8;
  pointer puVar9;
  byte bVar10;
  bool bVar11;
  CCoinsViewCache *pCVar12;
  UtxoData *this_02;
  uint64_t uVar13;
  iterator iVar14;
  int *piVar15;
  uint64_t uVar16;
  const_iterator cVar17;
  long *plVar18;
  mapped_type *pmVar19;
  Coin *a;
  _Base_ptr p_Var20;
  tuple<(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  this_03;
  undefined1 uVar21;
  uint uVar22;
  iterator __begin3;
  key_type *__k_00;
  CCoinsViewCacheTest *pCVar23;
  iterator in_R8;
  iterator pvVar24;
  iterator in_R9;
  iterator pvVar25;
  pointer *__ptr;
  pointer puVar26;
  CScript *pCVar27;
  ulong uVar28;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  pair<std::_Rb_tree_iterator<COutPoint>,_std::_Rb_tree_iterator<COutPoint>_> pVar29;
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  stack;
  CTxUndo undo;
  COutPoint outpoint;
  set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> utxoset;
  set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> duplicate_coins;
  set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> disconnected_coins;
  set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> coinbase_coins;
  CCoinsViewTest base;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  result;
  _func_int **local_428;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  undefined1 local_2f8 [64];
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  local_2b8;
  undefined1 local_298 [8];
  prevector<28U,_unsigned_char,_unsigned_int,_int> pStack_290;
  uint local_270;
  undefined1 local_268 [16];
  pointer local_258;
  CCoinsViewCache *pCStack_250;
  uint32_t local_248;
  undefined1 local_238 [8];
  undefined1 auStack_230 [16];
  vector<CTxOut,_std::allocator<CTxOut>_> vStack_220;
  vector<Coin,_std::allocator<Coin>_> local_208;
  vector<CTxIn,_std::allocator<CTxIn>_> local_1f0;
  vector<CTxOut,_std::allocator<CTxOut>_> local_1d8;
  undefined1 local_1b8 [8];
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_1b0;
  uchar local_190 [8];
  _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
  local_188;
  _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
  local_158;
  _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
  local_128;
  _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
  local_f8;
  undefined1 local_c8 [56];
  _List_node_base local_90;
  _List_node_base *local_80;
  _List_node_base *local_78;
  undefined1 local_70 [16];
  _Rb_tree_node_base local_60;
  ListNode *local_40;
  _Hashtable_ebo_helper<0,_PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>,_false>
  local_38;
  
  local_38._M_tp.m_resource =
       *(PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>
         *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest((BasicTestingSetup *)this,ZEROS);
  local_60._M_left = &local_60;
  local_60._M_color = 0;
  local_60._M_parent = (_Base_ptr)0x0;
  local_40 = (ListNode *)0x0;
  this_00 = &(this->super_UpdateTest).super_BasicTestingSetup.m_rng;
  local_80 = &local_90;
  local_c8._0_8_ = &PTR_GetCoin_0138a450;
  local_c8[0x10] = '\0';
  local_c8[0x11] = '\0';
  local_c8[0x12] = '\0';
  local_c8[0x13] = '\0';
  local_c8[0x14] = '\0';
  local_c8[0x15] = '\0';
  local_c8[0x16] = '\0';
  local_c8[0x17] = '\0';
  local_c8[0x18] = '\0';
  local_c8[0x19] = '\0';
  local_c8[0x1a] = '\0';
  local_c8[0x1b] = '\0';
  local_c8[0x1c] = '\0';
  local_c8[0x1d] = '\0';
  local_c8[0x1e] = '\0';
  local_c8[0x1f] = '\0';
  local_c8[0x20] = '\0';
  local_c8[0x21] = '\0';
  local_c8[0x22] = '\0';
  local_c8[0x23] = '\0';
  local_c8[0x24] = '\0';
  local_c8[0x25] = '\0';
  local_c8[0x26] = '\0';
  local_c8[0x27] = '\0';
  local_c8[0x28] = '\0';
  local_c8[0x29] = '\0';
  local_c8[0x2a] = '\0';
  local_c8[0x2b] = '\0';
  local_c8[0x2c] = '\0';
  local_c8[0x2d] = '\0';
  local_c8[0x2e] = '\0';
  local_c8[0x2f] = '\0';
  local_90._M_next._0_4_ = 0;
  local_90._M_prev = (_List_node_base *)0x0;
  local_70._0_8_ = (char *)0x0;
  local_2b8.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._8_8_ = this_00;
  local_78 = local_80;
  local_60._M_right = local_60._M_left;
  pCVar12 = (CCoinsViewCache *)operator_new(0x1c8);
  CCoinsViewCache::CCoinsViewCache(pCVar12,(CCoinsView *)local_c8,false);
  (pCVar12->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView =
       (_func_int **)&PTR_GetCoin_0138a4c0;
  local_238 = (undefined1  [8])pCVar12;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::push_back(&local_2b8,(value_type *)local_238);
  if (local_238 != (undefined1  [8])0x0) {
    (*(((CCoinsViewCache *)local_238)->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[7])
              ();
  }
  local_f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f8._M_impl.super__Rb_tree_header._M_header;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128._M_impl.super__Rb_tree_header._M_header;
  local_128._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_158._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_158._M_impl.super__Rb_tree_header._M_header;
  local_158._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_158._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_188._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_188._M_impl.super__Rb_tree_header._M_header;
  local_188._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_188._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_188._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_02 = &(this->super_UpdateTest).utxoData;
  local_428 = (_func_int **)0x0;
  uVar21 = 0;
  local_188._M_impl.super__Rb_tree_header._M_header._M_right =
       local_188._M_impl.super__Rb_tree_header._M_header._M_left;
  local_158._M_impl.super__Rb_tree_header._M_header._M_right =
       local_158._M_impl.super__Rb_tree_header._M_header._M_left;
  local_128._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128._M_impl.super__Rb_tree_header._M_header._M_left;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    uVar13 = RandomMixin<FastRandomContext>::randbits<32>
                       (&this_00->super_RandomMixin<FastRandomContext>);
    uVar22 = (int)uVar13 + (int)((uVar13 & 0xffffffff) / 0x14) * -0x14;
    if (uVar22 < 0x13) {
      CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_2f8);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2f8,1);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_2f8 + 0x18),1);
      (((CCoinsViewBacked *)local_2f8._24_8_)->super_CCoinsView)._vptr_CCoinsView = local_428;
      pCVar8 = (CCoinsViewBacked *)local_2f8._24_8_;
      uVar13 = RandomMixin<FastRandomContext>::randbits<32>
                         (&this_00->super_RandomMixin<FastRandomContext>);
      local_238 = (undefined1  [8])((ulong)local_238 & 0xffffffffffffff00);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::assign
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&pCVar8->base,
                 (uint)uVar13 & 0x3f,local_238);
      uVar13 = RandomMixin<FastRandomContext>::randbits<32>
                         (&this_00->super_RandomMixin<FastRandomContext>);
      CTxOut::CTxOut((CTxOut *)local_1b8);
      local_190[0] = '\0';
      local_190[1] = '\0';
      local_190[2] = '\0';
      local_190[3] = '\0';
      if ((uVar22 < 2) || (local_f8._M_impl.super__Rb_tree_header._M_node_count < (ListNode *)0xa))
      {
        do {
          uVar16 = RandomMixin<FastRandomContext>::randbits
                             (&this_00->super_RandomMixin<FastRandomContext>,4);
        } while (9 < uVar16);
        if ((uVar16 == 0) &&
           ((ListNode *)local_f8._M_impl.super__Rb_tree_header._M_node_count != (ListNode *)0x0)) {
          iVar14 = UpdateTest::FindRandomFrom
                             (&this->super_UpdateTest,
                              (set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                              &local_f8);
          CMutableTransaction::CMutableTransaction
                    ((CMutableTransaction *)local_238,(CTransaction *)&iVar14._M_node[4]._M_left);
          uVar4 = local_2f8._16_8_;
          pStack_290._union.indirect_contents.indirect = (char *)local_2f8._8_8_;
          local_298 = (undefined1  [8])local_2f8._0_8_;
          local_2f8._16_8_ = auStack_230._8_8_;
          local_2f8._0_8_ = local_238;
          local_2f8._8_8_ = auStack_230._0_8_;
          pStack_290._union.indirect_contents.capacity = (size_type)uVar4;
          pStack_290._union._12_4_ = SUB84(uVar4,4);
          local_238 = (undefined1  [8])0x0;
          auStack_230._0_8_ = (element_type *)0x0;
          auStack_230._8_8_ = (pointer)0x0;
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_298);
          uVar4 = local_2f8._40_8_;
          pStack_290._union.indirect_contents.indirect = (char *)local_2f8._32_8_;
          local_298 = (undefined1  [8])local_2f8._24_8_;
          local_2f8._40_8_ =
               vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_2f8._24_8_ =
               vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_2f8._32_8_ =
               vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_finish;
          pStack_290._union.indirect_contents.capacity = (size_type)uVar4;
          pStack_290._union._12_4_ = SUB84(uVar4,4);
          vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_298);
          local_2f8._48_8_ =
               local_208.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
               super__Vector_impl_data._M_start;
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_220);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_238);
          pVar29 = std::
                   _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
                   ::equal_range(&local_128,(key_type *)(iVar14._M_node + 1));
          std::
          _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
          ::_M_erase_aux(&local_128,(_Base_ptr)pVar29.first._M_node,(_Base_ptr)pVar29.second._M_node
                        );
          std::
          _Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
          ::_M_insert_unique<COutPoint_const&>
                    ((_Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
                      *)&local_158,(key_type *)(iVar14._M_node + 1));
        }
        else {
          CMutableTransaction::GetHash((Txid *)local_298,(CMutableTransaction *)local_2f8);
          auStack_230._8_8_ =
               CONCAT44(pStack_290._union._12_4_,pStack_290._union.indirect_contents.capacity);
          vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(pStack_290._union._20_4_,pStack_290._union._16_4_);
          local_238 = local_298;
          auStack_230._0_8_ = pStack_290._union.indirect_contents.indirect;
          vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((ulong)vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
          std::
          _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
          ::_M_insert_unique<COutPoint>(&local_f8,(COutPoint *)local_238);
        }
        CTransaction::CTransaction((CTransaction *)local_238,(CMutableTransaction *)local_2f8);
        if (auStack_230._0_8_ - (long)local_238 != 0x68) {
LAB_003249c7:
          __assert_fail("CTransaction(tx).IsCoinBase()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                        ,0x170,"void coins_tests::updatecoins_simulation_test::test_method()");
        }
        puVar1 = (((CCoinsViewCache *)local_238)->hashBlock).super_base_blob<256U>.m_data._M_elems +
                 0xf;
        piVar15 = (int *)std::
                         __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                                   (local_238,puVar1);
        if ((piVar15 != (int *)puVar1) || (*(int *)puVar1 != -1)) goto LAB_003249c7;
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_220);
        std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                  ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_238);
LAB_00323dea:
        if (local_2f8._32_8_ - local_2f8._24_8_ != 0x28) {
          __assert_fail("tx.vout.size() == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                        ,0x1a1,"void coins_tests::updatecoins_simulation_test::test_method()");
        }
        CMutableTransaction::GetHash((Txid *)local_238,(CMutableTransaction *)local_2f8);
        uVar4 = local_2f8._24_8_;
        local_258 = (pointer)auStack_230._8_8_;
        pCStack_250 = (CCoinsViewCache *)
                      vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_268._0_8_ = local_238;
        local_268._8_8_ = auStack_230._0_8_;
        local_248 = 0;
        CTransaction::CTransaction((CTransaction *)local_238,(CMutableTransaction *)local_2f8);
        uVar22 = 0;
        if (auStack_230._0_8_ - (long)local_238 == 0x68) {
          puVar1 = (uchar *)((long)local_238 + 0x20);
          plVar18 = (long *)std::
                            __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                                      (local_238,puVar1);
          uVar22 = (uint)(*(int *)puVar1 == -1 && plVar18 == (long *)puVar1);
        }
        local_298 = (undefined1  [8])
                    (((CCoinsViewBacked *)uVar4)->super_CCoinsView)._vptr_CCoinsView;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                  (&pStack_290,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                   &((CCoinsViewBacked *)uVar4)->base);
        local_270 = uVar22 | (uint)uVar13 & 0xfffffffe;
        pmVar19 = std::
                  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                  ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                                *)(local_70 + 8),(key_type *)local_268);
        (pmVar19->out).nValue = (CAmount)local_298;
        pCVar27 = &(pmVar19->out).scriptPubKey;
        if (0x1c < (pmVar19->out).scriptPubKey.super_CScriptBase._size) {
          free((pCVar27->super_CScriptBase)._union.indirect_contents.indirect);
        }
        *(ulong *)((long)&(pmVar19->out).scriptPubKey.super_CScriptBase._union + 0xc) =
             CONCAT44(pStack_290._union._16_4_,pStack_290._union._12_4_);
        *(ulong *)((long)&(pmVar19->out).scriptPubKey.super_CScriptBase._union + 0x14) =
             CONCAT44(pStack_290._union._24_4_,pStack_290._union._20_4_);
        (pCVar27->super_CScriptBase)._union.indirect_contents.indirect =
             pStack_290._union.indirect_contents.indirect;
        *(ulong *)((long)&(pmVar19->out).scriptPubKey.super_CScriptBase._union + 8) =
             CONCAT44(pStack_290._union._12_4_,pStack_290._union.indirect_contents.capacity);
        (pmVar19->out).scriptPubKey.super_CScriptBase._size = pStack_290._size;
        pStack_290._size = 0;
        *(uint *)&pmVar19->field_0x28 = local_270;
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_220);
        std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                  ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_238);
        local_298 = (undefined1  [8])0x0;
        pStack_290._union.indirect_contents.indirect = (char *)0x0;
        pStack_290._union.indirect_contents.capacity = 0;
        pStack_290._union.direct[0xc] = '\0';
        pStack_290._union.direct[0xd] = '\0';
        pStack_290._union.direct[0xe] = '\0';
        pStack_290._union.direct[0xf] = '\0';
        CTransaction::CTransaction((CTransaction *)local_238,(CMutableTransaction *)local_2f8);
        UpdateCoins((CTransaction *)local_238,
                    &(local_2b8.
                      super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                      super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                      .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                     _M_head_impl)->super_CCoinsViewCache,(CTxUndo *)local_298,
                    (uint)(uVar13 >> 1) & 0x7fffffff);
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_220);
        std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                  ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_238);
        std::
        _Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
        ::_M_insert_unique<COutPoint_const&>
                  ((_Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
                    *)&local_188,(COutPoint *)local_268);
        std::_Tuple_impl<0ul,CMutableTransaction,CTxUndo,Coin>::
        _Tuple_impl<CMutableTransaction&,CTxUndo&,Coin&,void>
                  ((_Tuple_impl<0ul,CMutableTransaction,CTxUndo,Coin> *)local_238,
                   (CMutableTransaction *)local_2f8,(CTxUndo *)local_298,(Coin *)local_1b8);
        std::
        _Rb_tree<COutPoint,std::pair<COutPoint_const,std::tuple<CTransaction,CTxUndo,Coin>>,std::_Select1st<std::pair<COutPoint_const,std::tuple<CTransaction,CTxUndo,Coin>>>,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,std::tuple<CTransaction,CTxUndo,Coin>>>>
        ::_M_emplace_unique<COutPoint_const&,std::tuple<CMutableTransaction,CTxUndo,Coin>>
                  ((_Rb_tree<COutPoint,std::pair<COutPoint_const,std::tuple<CTransaction,CTxUndo,Coin>>,std::_Select1st<std::pair<COutPoint_const,std::tuple<CTransaction,CTxUndo,Coin>>>,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,std::tuple<CTransaction,CTxUndo,Coin>>>>
                    *)this_02,(COutPoint *)local_268,
                   (tuple<CMutableTransaction,_CTxUndo,_Coin> *)local_238);
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_1d8);
        std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_1f0);
        std::vector<Coin,_std::allocator<Coin>_>::~vector(&local_208);
        if (0x1c < vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_finish._4_4_) {
          free((void *)auStack_230._0_8_);
        }
        std::vector<Coin,_std::allocator<Coin>_>::~vector
                  ((vector<Coin,_std::allocator<Coin>_> *)local_298);
        bVar11 = true;
      }
      else {
        pStack_290._union.indirect_contents.capacity = 0;
        pStack_290._union.direct[0xc] = '\0';
        pStack_290._union.direct[0xd] = '\0';
        pStack_290._union.direct[0xe] = '\0';
        pStack_290._union.direct[0xf] = '\0';
        pStack_290._union.direct[0x10] = '\0';
        pStack_290._union.direct[0x11] = '\0';
        pStack_290._union.direct[0x12] = '\0';
        pStack_290._union.direct[0x13] = '\0';
        pStack_290._union.direct[0x14] = '\0';
        pStack_290._union.direct[0x15] = '\0';
        pStack_290._union.direct[0x16] = '\0';
        pStack_290._union.direct[0x17] = '\0';
        local_298 = (undefined1  [8])0x0;
        pStack_290._union.indirect_contents.indirect = (char *)0x0;
        pStack_290._union._24_4_ = 0xffffffff;
        if ((uVar22 != 2) ||
           ((ListNode *)local_128._M_impl.super__Rb_tree_header._M_node_count == (ListNode *)0x0)) {
          iVar14 = UpdateTest::FindRandomFrom
                             (&this->super_UpdateTest,
                              (set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                              &local_188);
          pStack_290._union._24_4_ = iVar14._M_node[2]._M_color;
          local_298 = *(undefined1 (*) [8])(iVar14._M_node + 1);
          pStack_290._union.indirect_contents.indirect = (char *)iVar14._M_node[1]._M_parent;
          pStack_290._union.indirect_contents.capacity = (size_type)iVar14._M_node[1]._M_left;
          pStack_290._union._12_4_ = (undefined4)((ulong)iVar14._M_node[1]._M_left >> 0x20);
          pStack_290._union._16_4_ = SUB84(iVar14._M_node[1]._M_right,0);
          pStack_290._union._20_4_ = (undefined4)((ulong)iVar14._M_node[1]._M_right >> 0x20);
          pp_Var5 = *(_func_int ***)(iVar14._M_node + 1);
          p_Var2 = iVar14._M_node[1]._M_parent;
          p_Var6 = iVar14._M_node[1]._M_left;
          p_Var7 = iVar14._M_node[1]._M_right;
          *(_Rb_tree_color *)
           ((((uint256 *)(local_2f8._0_8_ + 0x11))->super_base_blob<256U>).m_data._M_elems + 0xf) =
               iVar14._M_node[2]._M_color;
          *(_Base_ptr *)(local_2f8._0_8_ + 0x10) = p_Var6;
          *(_Base_ptr *)
           ((((uint256 *)(local_2f8._0_8_ + 0x11))->super_base_blob<256U>).m_data._M_elems + 7) =
               p_Var7;
          (((CCoinsViewBacked *)local_2f8._0_8_)->super_CCoinsView)._vptr_CCoinsView = pp_Var5;
          ((CCoinsViewBacked *)local_2f8._0_8_)->base = (CCoinsView *)p_Var2;
          CTransaction::CTransaction((CTransaction *)local_238,(CMutableTransaction *)local_2f8);
          if (auStack_230._0_8_ - (long)local_238 == 0x68) {
            puVar1 = (uchar *)((long)local_238 + 0x20);
            plVar18 = (long *)std::
                              __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                                        (local_238,puVar1);
            if ((plVar18 == (long *)puVar1) && (*(int *)puVar1 == -1)) {
              __assert_fail("!CTransaction(tx).IsCoinBase()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                            ,400,"void coins_tests::updatecoins_simulation_test::test_method()");
            }
          }
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_220);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_238);
LAB_00323d34:
          pmVar19 = std::
                    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                                  *)(local_70 + 8),(key_type *)local_298);
          local_1b8 = (undefined1  [8])(pmVar19->out).nValue;
          prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                    (&local_1b0,&(pmVar19->out).scriptPubKey.super_CScriptBase);
          local_190[0] = pmVar19->field_0x28;
          local_190[1] = pmVar19->field_0x29;
          local_190[2] = pmVar19->field_0x2a;
          local_190[3] = pmVar19->field_0x2b;
          pmVar19 = std::
                    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                                  *)(local_70 + 8),(key_type *)local_298);
          Coin::Clear(pmVar19);
          pVar29 = std::
                   _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
                   ::equal_range(&local_188,(key_type *)local_298);
          std::
          _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
          ::_M_erase_aux(&local_188,(_Base_ptr)pVar29.first._M_node,(_Base_ptr)pVar29.second._M_node
                        );
          cVar17 = std::
                   _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
                   ::find(&local_158,(key_type *)local_298);
          if ((_Rb_tree_header *)cVar17._M_node != &local_158._M_impl.super__Rb_tree_header) {
            uVar21 = 1;
          }
          goto LAB_00323dea;
        }
        iVar14 = UpdateTest::FindRandomFrom
                           (&this->super_UpdateTest,
                            (set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                            &local_128);
        CMutableTransaction::CMutableTransaction
                  ((CMutableTransaction *)local_238,(CTransaction *)&iVar14._M_node[4]._M_left);
        local_258 = (pointer)local_2f8._16_8_;
        local_268._8_8_ = local_2f8._8_8_;
        local_268._0_8_ = local_2f8._0_8_;
        local_2f8._16_8_ = auStack_230._8_8_;
        local_2f8._0_8_ = local_238;
        local_2f8._8_8_ = auStack_230._0_8_;
        local_238 = (undefined1  [8])0x0;
        auStack_230._0_8_ = (element_type *)0x0;
        auStack_230._8_8_ = (pointer)0x0;
        std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                  ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_268);
        local_258 = (pointer)local_2f8._40_8_;
        local_268._8_8_ = local_2f8._32_8_;
        local_268._0_8_ = local_2f8._24_8_;
        local_2f8._40_8_ =
             vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_2f8._24_8_ =
             vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_2f8._32_8_ =
             vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_finish;
        vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                  ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_268);
        local_2f8._48_8_ =
             local_208.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
             super__Vector_impl_data._M_start;
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_220);
        std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                  ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_238);
        local_298 = (undefined1  [8])
                    (((CCoinsViewBacked *)local_2f8._0_8_)->super_CCoinsView)._vptr_CCoinsView;
        pStack_290._union.indirect_contents.indirect =
             (char *)((CCoinsViewBacked *)local_2f8._0_8_)->base;
        uVar4 = *(undefined8 *)
                 ((((uint256 *)(local_2f8._0_8_ + 0x11))->super_base_blob<256U>).m_data._M_elems + 7
                 );
        pStack_290._union.indirect_contents.capacity =
             (size_type)*(undefined8 *)(local_2f8._0_8_ + 0x10);
        pStack_290._union._12_4_ =
             (undefined4)((ulong)*(undefined8 *)(local_2f8._0_8_ + 0x10) >> 0x20);
        pStack_290._union._16_4_ = (undefined4)uVar4;
        pStack_290._union._20_4_ = (undefined4)((ulong)uVar4 >> 0x20);
        pStack_290._union._24_4_ =
             *(undefined4 *)
              ((((uint256 *)(local_2f8._0_8_ + 0x11))->super_base_blob<256U>).m_data._M_elems + 0xf)
        ;
        CTransaction::CTransaction((CTransaction *)local_238,(CMutableTransaction *)local_2f8);
        __k_00 = (key_type *)(iVar14._M_node + 1);
        if (auStack_230._0_8_ - (long)local_238 == 0x68) {
          puVar1 = (((CCoinsViewCache *)local_238)->hashBlock).super_base_blob<256U>.m_data._M_elems
                   + 0xf;
          piVar15 = (int *)std::
                           __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                                     (local_238,puVar1);
          if ((piVar15 != (int *)puVar1) || (*(int *)puVar1 != -1)) goto LAB_00323c23;
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_220);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_238);
LAB_00323c66:
          cVar17 = std::
                   _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
                   ::find(&local_188,__k_00);
          if ((_Rb_tree_header *)cVar17._M_node != &local_188._M_impl.super__Rb_tree_header) {
            CTransaction::CTransaction((CTransaction *)local_238,(CMutableTransaction *)local_2f8);
            if (auStack_230._0_8_ - (long)local_238 != 0x68) {
LAB_00324a05:
              __assert_fail("CTransaction(tx).IsCoinBase()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                            ,0x183,"void coins_tests::updatecoins_simulation_test::test_method()");
            }
            puVar1 = (uchar *)((long)local_238 + 0x20);
            plVar18 = (long *)std::
                              __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                                        (local_238,puVar1);
            if ((plVar18 != (long *)puVar1) || (*(int *)puVar1 != -1)) goto LAB_00324a05;
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_220);
            std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_238);
            cVar17 = std::
                     _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
                     ::find(&local_158,__k_00);
            if ((_Rb_tree_header *)cVar17._M_node == &local_158._M_impl.super__Rb_tree_header) {
              __assert_fail("duplicate_coins.count(utxod->first)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                            ,0x184,"void coins_tests::updatecoins_simulation_test::test_method()");
            }
          }
          pVar29 = std::
                   _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
                   ::equal_range(&local_128,__k_00);
          std::
          _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
          ::_M_erase_aux(&local_128,(_Base_ptr)pVar29.first._M_node,(_Base_ptr)pVar29.second._M_node
                        );
          goto LAB_00323d34;
        }
LAB_00323c23:
        cVar17 = std::
                 _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
                 ::find(&local_188,(key_type *)local_298);
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_220);
        std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                  ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_238);
        if ((_Rb_tree_header *)cVar17._M_node != &local_188._M_impl.super__Rb_tree_header)
        goto LAB_00323c66;
        pVar29 = std::
                 _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
                 ::equal_range(&local_128,__k_00);
        std::
        _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
        ::_M_erase_aux(&local_128,(_Base_ptr)pVar29.first._M_node,(_Base_ptr)pVar29.second._M_node);
        bVar11 = false;
      }
      if (0x1c < local_1b0._size) {
        free(local_1b0._union.indirect_contents.indirect);
      }
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_2f8 + 0x18));
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2f8);
      if (bVar11) goto LAB_00324084;
    }
    else {
      if ((ListNode *)local_188._M_impl.super__Rb_tree_header._M_node_count != (ListNode *)0x0) {
        iVar14 = UpdateTest::FindRandomFrom
                           (&this->super_UpdateTest,
                            (set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                            &local_188);
        __k = (key_type *)(iVar14._M_node + 1);
        pmVar19 = std::
                  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                  ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                                *)(local_70 + 8),__k);
        Coin::Clear(pmVar19);
        this_01 = &iVar14._M_node[4]._M_left;
        bVar11 = CTransaction::IsCoinBase((CTransaction *)this_01);
        if (!bVar11) {
          pmVar19 = std::
                    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                                  *)(local_70 + 8),(key_type *)*this_01);
          (pmVar19->out).nValue = (CAmount)iVar14._M_node[2]._M_parent;
          prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                    (&(pmVar19->out).scriptPubKey.super_CScriptBase,
                     (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&iVar14._M_node[2]._M_left)
          ;
          *(undefined4 *)&pmVar19->field_0x28 = *(undefined4 *)&iVar14._M_node[3]._M_left;
        }
        local_308 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_300 = "";
        local_318 = &boost::unit_test::basic_cstring<char_const>::null;
        local_310 = &boost::unit_test::basic_cstring<char_const>::null;
        file.m_end = (iterator)0x1c1;
        file.m_begin = (iterator)&local_308;
        msg.m_end = in_R9;
        msg.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_318,
                   msg);
        puVar9 = local_2b8.
                 super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar11 = CCoinsViewCache::SpendCoin
                           (&(local_2b8.
                              super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                              super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                              .
                              super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                             ._M_head_impl)->super_CCoinsViewCache,__k,(Coin *)0x0);
        local_2f8[0] = (class_property<bool>)(class_property<bool>)bVar11;
        local_2f8._8_8_ = (element_type *)0x0;
        local_2f8._16_8_ = (pointer)0x0;
        local_1b8 = (undefined1  [8])0xe4a9e2;
        local_1b0._union.indirect_contents.indirect = "";
        auStack_230._0_8_ = auStack_230._0_8_ & 0xffffffffffffff00;
        local_238 = (undefined1  [8])&PTR__lazy_ostream_01389048;
        auStack_230._8_8_ = boost::unit_test::lazy_ostream::inst;
        vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_1b8;
        local_328 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_320 = "";
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_2f8,(lazy_ostream *)local_238,1,0,WARN,(check_type)this
                   ,(size_t)&local_328,0x1c1);
        boost::detail::shared_count::~shared_count((shared_count *)(local_2f8 + 0x10));
        bVar11 = CTransaction::IsCoinBase((CTransaction *)this_01);
        if (!bVar11) {
          out = (COutPoint *)iVar14._M_node[4]._M_left;
          p_Var2 = iVar14._M_node[3]._M_right;
          local_238 = *(undefined1 (*) [8])p_Var2;
          prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)auStack_230,
                     (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&p_Var2->_M_parent);
          vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)CONCAT44(vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 *(undefined4 *)&p_Var2[1]._M_parent);
          ApplyTxInUndo((Coin *)local_238,
                        &(puVar9[-1]._M_t.
                          super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                          .
                          super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                         ._M_head_impl)->super_CCoinsViewCache,out);
          if (0x1c < vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish._4_4_) {
            free((void *)auStack_230._0_8_);
          }
        }
        std::
        _Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
        ::_M_insert_unique<COutPoint_const&>
                  ((_Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
                    *)&local_128,__k);
        pVar29 = std::
                 _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
                 ::equal_range(&local_188,__k);
        std::
        _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
        ::_M_erase_aux(&local_188,(_Base_ptr)pVar29.first._M_node,(_Base_ptr)pVar29.second._M_node);
        bVar11 = CTransaction::IsCoinBase((CTransaction *)this_01);
        if (!bVar11) {
          std::
          _Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
          ::_M_insert_unique<COutPoint_const&>
                    ((_Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
                      *)&local_188,(COutPoint *)*this_01);
        }
      }
LAB_00324084:
      do {
        uVar13 = RandomMixin<FastRandomContext>::randbits
                           (&this_00->super_RandomMixin<FastRandomContext>,10);
      } while (999 < uVar13);
      p_Var20 = local_60._M_left;
      if (local_60._M_left != &local_60 && (local_428 == (_func_int **)0x9c3f || uVar13 == 1)) {
        do {
          pCVar23 = local_2b8.
                    super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                    super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                    _M_head_impl;
          bVar10 = (**(code **)(*(long *)&(pCVar23->super_CCoinsViewCache).super_CCoinsViewBacked +
                               8))(pCVar23,(COutPoint *)(p_Var20 + 1));
          a = CCoinsViewCache::AccessCoin
                        (&(local_2b8.
                           super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                           super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                           .
                           super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                          ._M_head_impl)->super_CCoinsViewCache,(COutPoint *)(p_Var20 + 1));
          local_338 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
          ;
          local_330 = "";
          local_348 = &boost::unit_test::basic_cstring<char_const>::null;
          local_340 = &boost::unit_test::basic_cstring<char_const>::null;
          file_00.m_end = (iterator)0x1d6;
          file_00.m_begin = (iterator)&local_338;
          msg_00.m_end = in_R9;
          msg_00.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
                     (size_t)&local_348,msg_00);
          local_2f8._8_8_ = (element_type *)0x0;
          local_2f8._16_8_ = (pointer)0x0;
          local_1b8 = (undefined1  [8])0xe4aa08;
          local_1b0._union.indirect_contents.indirect = "";
          auStack_230._0_8_ = auStack_230._0_8_ & 0xffffffffffffff00;
          local_238 = (undefined1  [8])&PTR__lazy_ostream_01389048;
          auStack_230._8_8_ = boost::unit_test::lazy_ostream::inst;
          vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_1b8;
          local_358 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
          ;
          local_350 = "";
          pvVar24 = (iterator)0x1;
          pvVar25 = (iterator)0x0;
          local_2f8[0] = (class_property<bool>)
                         (class_property<bool>)(bVar10 ^ (a->out).nValue == -1);
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_2f8,(lazy_ostream *)local_238,1,0,WARN,
                     (check_type)this,(size_t)&local_358,0x1d6);
          boost::detail::shared_count::~shared_count((shared_count *)(local_2f8 + 0x10));
          local_368 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
          ;
          local_360 = "";
          local_378 = &boost::unit_test::basic_cstring<char_const>::null;
          local_370 = &boost::unit_test::basic_cstring<char_const>::null;
          file_01.m_end = (iterator)0x1d7;
          file_01.m_begin = (iterator)&local_368;
          msg_01.m_end = pvVar25;
          msg_01.m_begin = pvVar24;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                     (size_t)&local_378,msg_01);
          local_2f8[0] = (class_property<bool>)
                         anon_unknown.dwarf_690ada::operator==(a,(Coin *)&p_Var20[2]._M_parent);
          local_2f8._8_8_ = (element_type *)0x0;
          local_2f8._16_8_ = (pointer)0x0;
          local_1b8 = (undefined1  [8])0xe4aa20;
          local_1b0._union.indirect_contents.indirect = "";
          auStack_230._0_8_ = auStack_230._0_8_ & 0xffffffffffffff00;
          local_238 = (undefined1  [8])&PTR__lazy_ostream_01389048;
          auStack_230._8_8_ = boost::unit_test::lazy_ostream::inst;
          vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_1b8;
          local_388 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
          ;
          local_380 = "";
          in_R8 = (iterator)0x1;
          in_R9 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_2f8,(lazy_ostream *)local_238,1,0,WARN,
                     (check_type)this,(size_t)&local_388,0x1d7);
          boost::detail::shared_count::~shared_count((shared_count *)(local_2f8 + 0x10));
          p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20);
        } while (p_Var20 != &local_60);
      }
      if ((ListNode *)0x1 < local_188._M_impl.super__Rb_tree_header._M_node_count) {
        do {
          uVar13 = RandomMixin<FastRandomContext>::randbits
                             (&this_00->super_RandomMixin<FastRandomContext>,5);
        } while (0x1d < uVar13);
        if (uVar13 == 0) {
          uVar13 = RandomMixin<FastRandomContext>::randbits<32>
                             (&this_00->super_RandomMixin<FastRandomContext>);
          pCVar12 = &(local_2b8.
                      super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [(uVar13 & 0xffffffff) %
                       (ulong)((long)local_2b8.
                                     super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2b8.
                                     super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3)]._M_t.
                      super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                      .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                     _M_head_impl)->super_CCoinsViewCache;
          iVar14 = UpdateTest::FindRandomFrom
                             (&this->super_UpdateTest,
                              (set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                              &local_188);
          CCoinsViewCache::Uncache(pCVar12,(COutPoint *)(iVar14._M_node + 1));
        }
      }
      if ((ListNode *)0x1 < local_128._M_impl.super__Rb_tree_header._M_node_count) {
        do {
          uVar13 = RandomMixin<FastRandomContext>::randbits
                             (&this_00->super_RandomMixin<FastRandomContext>,5);
        } while (0x1d < uVar13);
        if (uVar13 == 0) {
          uVar13 = RandomMixin<FastRandomContext>::randbits<32>
                             (&this_00->super_RandomMixin<FastRandomContext>);
          pCVar12 = &(local_2b8.
                      super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [(uVar13 & 0xffffffff) %
                       (ulong)((long)local_2b8.
                                     super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2b8.
                                     super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3)]._M_t.
                      super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                      .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                     _M_head_impl)->super_CCoinsViewCache;
          iVar14 = UpdateTest::FindRandomFrom
                             (&this->super_UpdateTest,
                              (set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                              &local_128);
          CCoinsViewCache::Uncache(pCVar12,(COutPoint *)(iVar14._M_node + 1));
        }
      }
      if ((ListNode *)0x1 < local_158._M_impl.super__Rb_tree_header._M_node_count) {
        do {
          uVar13 = RandomMixin<FastRandomContext>::randbits
                             (&this_00->super_RandomMixin<FastRandomContext>,5);
        } while (0x1d < uVar13);
        if (uVar13 == 0) {
          uVar13 = RandomMixin<FastRandomContext>::randbits<32>
                             (&this_00->super_RandomMixin<FastRandomContext>);
          pCVar12 = &(local_2b8.
                      super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [(uVar13 & 0xffffffff) %
                       (ulong)((long)local_2b8.
                                     super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2b8.
                                     super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3)]._M_t.
                      super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                      .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                     _M_head_impl)->super_CCoinsViewCache;
          iVar14 = UpdateTest::FindRandomFrom
                             (&this->super_UpdateTest,
                              (set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                              &local_158);
          CCoinsViewCache::Uncache(pCVar12,(COutPoint *)(iVar14._M_node + 1));
        }
      }
      do {
        uVar13 = RandomMixin<FastRandomContext>::randbits
                           (&this_00->super_RandomMixin<FastRandomContext>,7);
        puVar9 = local_2b8.
                 super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (99 < uVar13);
      if (((uVar13 == 0) &&
          (uVar28 = (long)local_2b8.
                          super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_2b8.
                          super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3, 1 < uVar28)) &&
         (uVar13 = RandomMixin<FastRandomContext>::randbits<1>
                             (&this_00->super_RandomMixin<FastRandomContext>), uVar13 == 0)) {
        uVar28 = uVar28 - 2;
        if (uVar28 == 0) {
          uVar22 = 0x40;
        }
        else {
          lVar3 = 0x3f;
          if (uVar28 != 0) {
            for (; uVar28 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          uVar22 = (uint)lVar3 ^ 0x3f;
        }
        do {
          uVar13 = RandomMixin<FastRandomContext>::randbits
                             (&this_00->super_RandomMixin<FastRandomContext>,0x40 - uVar22);
        } while (uVar28 < uVar13);
        local_398 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_390 = "";
        local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_02.m_end = (iterator)0x1ea;
        file_02.m_begin = (iterator)&local_398;
        msg_02.m_end = in_R9;
        msg_02.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3a8
                   ,msg_02);
        bVar11 = CCoinsViewCache::Flush
                           (&(puVar9[uVar13 & 0xffffffff]._M_t.
                              super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                              .
                              super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                             ._M_head_impl)->super_CCoinsViewCache);
        local_2f8[0] = (class_property<bool>)(class_property<bool>)bVar11;
        local_2f8._8_8_ = (element_type *)0x0;
        local_2f8._16_8_ = (pointer)0x0;
        local_1b8 = (undefined1  [8])0xe4aa35;
        local_1b0._union.indirect_contents.indirect = "";
        auStack_230._0_8_ = auStack_230._0_8_ & 0xffffffffffffff00;
        local_238 = (undefined1  [8])&PTR__lazy_ostream_01389048;
        auStack_230._8_8_ = boost::unit_test::lazy_ostream::inst;
        vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_1b8;
        local_3b8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_3b0 = "";
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_2f8,(lazy_ostream *)local_238,1,0,WARN,(check_type)this
                   ,(size_t)&local_3b8,0x1ea);
        boost::detail::shared_count::~shared_count((shared_count *)(local_2f8 + 0x10));
      }
      do {
        uVar13 = RandomMixin<FastRandomContext>::randbits
                           (&this_00->super_RandomMixin<FastRandomContext>,7);
        puVar26 = local_2b8.
                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        puVar9 = local_2b8.
                 super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (99 < uVar13);
      if (uVar13 == 0) {
        if ((local_2b8.
             super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish !=
             local_2b8.
             super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) &&
           (uVar13 = RandomMixin<FastRandomContext>::randbits<1>
                               (&this_00->super_RandomMixin<FastRandomContext>), uVar13 == 0)) {
          local_3c8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
          ;
          local_3c0 = "";
          local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_03.m_end = (iterator)0x1f0;
          file_03.m_begin = (iterator)&local_3c8;
          msg_03.m_end = in_R9;
          msg_03.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
                     (size_t)&local_3d8,msg_03);
          bVar11 = CCoinsViewCache::Flush
                             (&(puVar26[-1]._M_t.
                                super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                               ._M_head_impl)->super_CCoinsViewCache);
          local_2f8[0] = (class_property<bool>)(class_property<bool>)bVar11;
          local_2f8._8_8_ = (element_type *)0x0;
          local_2f8._16_8_ = (pointer)0x0;
          local_1b8 = (undefined1  [8])0xe4aa50;
          local_1b0._union.indirect_contents.indirect = "";
          auStack_230._0_8_ = auStack_230._0_8_ & 0xffffffffffffff00;
          local_238 = (undefined1  [8])&PTR__lazy_ostream_01389048;
          auStack_230._8_8_ = boost::unit_test::lazy_ostream::inst;
          vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_1b8;
          local_3e8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
          ;
          local_3e0 = "";
          in_R8 = (iterator)0x1;
          in_R9 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_2f8,(lazy_ostream *)local_238,1,0,WARN,
                     (check_type)this,(size_t)&local_3e8,0x1f0);
          puVar26 = puVar26 + -1;
          boost::detail::shared_count::~shared_count((shared_count *)(local_2f8 + 0x10));
          pCVar23 = (puVar26->_M_t).
                    super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                    _M_head_impl;
          local_2b8.
          super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = puVar26;
          if (pCVar23 != (CCoinsViewCacheTest *)0x0) {
            (**(code **)(*(long *)&(pCVar23->super_CCoinsViewCache).super_CCoinsViewBacked + 0x38))
                      ();
          }
          (puVar26->_M_t).
          super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
          .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
               (CCoinsViewCacheTest *)0x0;
        }
        pCVar23 = (CCoinsViewCacheTest *)local_c8;
        if (puVar26 != puVar9) {
          if ((0x1f < (ulong)((long)puVar26 - (long)puVar9)) ||
             (uVar13 = RandomMixin<FastRandomContext>::randbits<1>
                                 (&this_00->super_RandomMixin<FastRandomContext>), uVar13 == 0))
          goto LAB_0032466d;
          pCVar23 = puVar26[-1]._M_t.
                    super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                    _M_head_impl;
        }
        this_03.
        super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
        .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
              )operator_new(0x1c8);
        CCoinsViewCache::CCoinsViewCache
                  ((CCoinsViewCache *)
                   this_03.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                   _M_head_impl,(CCoinsView *)pCVar23,false);
        *(undefined ***)
         this_03.
         super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
         .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
             &PTR_GetCoin_0138a4c0;
        local_238 = (undefined1  [8])
                    this_03.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                    _M_head_impl;
        std::
        vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
        ::push_back(&local_2b8,(value_type *)local_238);
        if ((_Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
             )local_238 != (CCoinsViewCacheTest *)0x0) {
          (**(code **)(*(long *)local_238 + 0x38))();
        }
      }
    }
LAB_0032466d:
    local_428 = (_func_int **)((long)local_428 + 1);
    if (local_428 == (_func_int **)0x9c40) {
      local_3f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_3f0 = "";
      local_408 = &boost::unit_test::basic_cstring<char_const>::null;
      local_400 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x1fe;
      file_04.m_begin = (iterator)&local_3f8;
      msg_04.m_end = in_R9;
      msg_04.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_408,
                 msg_04);
      local_2f8._0_8_ = CONCAT71(local_2f8._1_7_,uVar21);
      local_2f8._8_8_ = (element_type *)0x0;
      local_2f8._16_8_ = (pointer)0x0;
      local_1b8 = (undefined1  [8])0xe4aa66;
      local_1b0._union.indirect_contents.indirect = "";
      auStack_230._0_8_ = auStack_230._0_8_ & 0xffffffffffffff00;
      local_238 = (undefined1  [8])&PTR__lazy_ostream_01389048;
      auStack_230._8_8_ = boost::unit_test::lazy_ostream::inst;
      vStack_220.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)local_1b8;
      local_418 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_410 = "";
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_2f8,(lazy_ostream *)local_238,1,0,WARN,(check_type)this,
                 (size_t)&local_418,0x1fe);
      boost::detail::shared_count::~shared_count((shared_count *)(local_2f8 + 0x10));
      std::
      _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
      ::~_Rb_tree(&local_188);
      std::
      _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
      ::~_Rb_tree(&local_158);
      std::
      _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
      ::~_Rb_tree(&local_128);
      std::
      _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
      ::~_Rb_tree(&local_f8);
      std::
      vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
      ::~vector(&local_2b8);
      local_c8._0_8_ = &PTR_GetCoin_0138a450;
      std::
      _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
      ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                   *)(local_c8 + 0x30));
      std::
      _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
      ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                   *)(local_70 + 8));
      if ((PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>
           )*(PoolResource<144UL,_8UL> **)(in_FS_OFFSET + 0x28) != local_38._M_tp.m_resource) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

BOOST_FIXTURE_TEST_CASE(updatecoins_simulation_test, UpdateTest)
{
    SeedRandomForTest(SeedRand::ZEROS);

    bool spent_a_duplicate_coinbase = false;
    // A simple map to track what we expect the cache stack to represent.
    std::map<COutPoint, Coin> result;

    // The cache stack.
    CCoinsViewTest base{m_rng}; // A CCoinsViewTest at the bottom.
    std::vector<std::unique_ptr<CCoinsViewCacheTest>> stack; // A stack of CCoinsViewCaches on top.
    stack.push_back(std::make_unique<CCoinsViewCacheTest>(&base)); // Start with one cache.

    // Track the txids we've used in various sets
    std::set<COutPoint> coinbase_coins;
    std::set<COutPoint> disconnected_coins;
    std::set<COutPoint> duplicate_coins;
    std::set<COutPoint> utxoset;

    for (unsigned int i = 0; i < NUM_SIMULATION_ITERATIONS; i++) {
        uint32_t randiter = m_rng.rand32();

        // 19/20 txs add a new transaction
        if (randiter % 20 < 19) {
            CMutableTransaction tx;
            tx.vin.resize(1);
            tx.vout.resize(1);
            tx.vout[0].nValue = i; //Keep txs unique unless intended to duplicate
            tx.vout[0].scriptPubKey.assign(m_rng.rand32() & 0x3F, 0); // Random sizes so we can test memory usage accounting
            const int height{int(m_rng.rand32() >> 1)};
            Coin old_coin;

            // 2/20 times create a new coinbase
            if (randiter % 20 < 2 || coinbase_coins.size() < 10) {
                // 1/10 of those times create a duplicate coinbase
                if (m_rng.randrange(10) == 0 && coinbase_coins.size()) {
                    auto utxod = FindRandomFrom(coinbase_coins);
                    // Reuse the exact same coinbase
                    tx = CMutableTransaction{std::get<0>(utxod->second)};
                    // shouldn't be available for reconnection if it's been duplicated
                    disconnected_coins.erase(utxod->first);

                    duplicate_coins.insert(utxod->first);
                }
                else {
                    coinbase_coins.insert(COutPoint(tx.GetHash(), 0));
                }
                assert(CTransaction(tx).IsCoinBase());
            }

            // 17/20 times reconnect previous or add a regular tx
            else {

                COutPoint prevout;
                // 1/20 times reconnect a previously disconnected tx
                if (randiter % 20 == 2 && disconnected_coins.size()) {
                    auto utxod = FindRandomFrom(disconnected_coins);
                    tx = CMutableTransaction{std::get<0>(utxod->second)};
                    prevout = tx.vin[0].prevout;
                    if (!CTransaction(tx).IsCoinBase() && !utxoset.count(prevout)) {
                        disconnected_coins.erase(utxod->first);
                        continue;
                    }

                    // If this tx is already IN the UTXO, then it must be a coinbase, and it must be a duplicate
                    if (utxoset.count(utxod->first)) {
                        assert(CTransaction(tx).IsCoinBase());
                        assert(duplicate_coins.count(utxod->first));
                    }
                    disconnected_coins.erase(utxod->first);
                }

                // 16/20 times create a regular tx
                else {
                    auto utxod = FindRandomFrom(utxoset);
                    prevout = utxod->first;

                    // Construct the tx to spend the coins of prevouthash
                    tx.vin[0].prevout = prevout;
                    assert(!CTransaction(tx).IsCoinBase());
                }
                // In this simple test coins only have two states, spent or unspent, save the unspent state to restore
                old_coin = result[prevout];
                // Update the expected result of prevouthash to know these coins are spent
                result[prevout].Clear();

                utxoset.erase(prevout);

                // The test is designed to ensure spending a duplicate coinbase will work properly
                // if that ever happens and not resurrect the previously overwritten coinbase
                if (duplicate_coins.count(prevout)) {
                    spent_a_duplicate_coinbase = true;
                }

            }
            // Update the expected result to know about the new output coins
            assert(tx.vout.size() == 1);
            const COutPoint outpoint(tx.GetHash(), 0);
            result[outpoint] = Coin{tx.vout[0], height, CTransaction{tx}.IsCoinBase()};

            // Call UpdateCoins on the top cache
            CTxUndo undo;
            UpdateCoins(CTransaction{tx}, *(stack.back()), undo, height);

            // Update the utxo set for future spends
            utxoset.insert(outpoint);

            // Track this tx and undo info to use later
            utxoData.emplace(outpoint, std::make_tuple(tx,undo,old_coin));
        } else if (utxoset.size()) {
            //1/20 times undo a previous transaction
            auto utxod = FindRandomFrom(utxoset);

            CTransaction &tx = std::get<0>(utxod->second);
            CTxUndo &undo = std::get<1>(utxod->second);
            Coin &orig_coin = std::get<2>(utxod->second);

            // Update the expected result
            // Remove new outputs
            result[utxod->first].Clear();
            // If not coinbase restore prevout
            if (!tx.IsCoinBase()) {
                result[tx.vin[0].prevout] = orig_coin;
            }

            // Disconnect the tx from the current UTXO
            // See code in DisconnectBlock
            // remove outputs
            BOOST_CHECK(stack.back()->SpendCoin(utxod->first));
            // restore inputs
            if (!tx.IsCoinBase()) {
                const COutPoint &out = tx.vin[0].prevout;
                Coin coin = undo.vprevout[0];
                ApplyTxInUndo(std::move(coin), *(stack.back()), out);
            }
            // Store as a candidate for reconnection
            disconnected_coins.insert(utxod->first);

            // Update the utxoset
            utxoset.erase(utxod->first);
            if (!tx.IsCoinBase())
                utxoset.insert(tx.vin[0].prevout);
        }

        // Once every 1000 iterations and at the end, verify the full cache.
        if (m_rng.randrange(1000) == 1 || i == NUM_SIMULATION_ITERATIONS - 1) {
            for (const auto& entry : result) {
                bool have = stack.back()->HaveCoin(entry.first);
                const Coin& coin = stack.back()->AccessCoin(entry.first);
                BOOST_CHECK(have == !coin.IsSpent());
                BOOST_CHECK(coin == entry.second);
            }
        }

        // One every 10 iterations, remove a random entry from the cache
        if (utxoset.size() > 1 && m_rng.randrange(30) == 0) {
            stack[m_rng.rand32() % stack.size()]->Uncache(FindRandomFrom(utxoset)->first);
        }
        if (disconnected_coins.size() > 1 && m_rng.randrange(30) == 0) {
            stack[m_rng.rand32() % stack.size()]->Uncache(FindRandomFrom(disconnected_coins)->first);
        }
        if (duplicate_coins.size() > 1 && m_rng.randrange(30) == 0) {
            stack[m_rng.rand32() % stack.size()]->Uncache(FindRandomFrom(duplicate_coins)->first);
        }

        if (m_rng.randrange(100) == 0) {
            // Every 100 iterations, flush an intermediate cache
            if (stack.size() > 1 && m_rng.randbool() == 0) {
                unsigned int flushIndex = m_rng.randrange(stack.size() - 1);
                BOOST_CHECK(stack[flushIndex]->Flush());
            }
        }
        if (m_rng.randrange(100) == 0) {
            // Every 100 iterations, change the cache stack.
            if (stack.size() > 0 && m_rng.randbool() == 0) {
                BOOST_CHECK(stack.back()->Flush());
                stack.pop_back();
            }
            if (stack.size() == 0 || (stack.size() < 4 && m_rng.randbool())) {
                CCoinsView* tip = &base;
                if (stack.size() > 0) {
                    tip = stack.back().get();
                }
                stack.push_back(std::make_unique<CCoinsViewCacheTest>(tip));
            }
        }
    }

    // Verify coverage.
    BOOST_CHECK(spent_a_duplicate_coinbase);
}